

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

void Vec_StrPutS_(Vec_Str_t *vOut,char *Val)

{
  for (; *Val != '\0'; Val = Val + 1) {
    Vec_StrPush(vOut,*Val);
  }
  Vec_StrPush(vOut,'\0');
  return;
}

Assistant:

static inline void Vec_StrPutS_( Vec_Str_t * vOut, char * Val )  { Vec_StrPutS( vOut, Val );  }